

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O3

int Fraig_ManSimulateBitNode(Fraig_Man_t *p,Fraig_Node_t *pNode,int *pModel)

{
  Fraig_Node_t *pFVar1;
  uint uVar2;
  Fraig_NodeVec_t *pFVar3;
  long lVar4;
  
  Fraig_ManIncrementTravId(p);
  pFVar3 = p->vInputs;
  if (0 < pFVar3->nSize) {
    lVar4 = 0;
    do {
      Fraig_NodeSetTravIdCurrent(p,pFVar3->pArray[lVar4]);
      pFVar1 = p->vInputs->pArray[lVar4];
      *(uint *)&pFVar1->field_0x18 =
           *(uint *)&pFVar1->field_0x18 & 0xffffffbf | (pModel[lVar4] & 1U) << 6;
      lVar4 = lVar4 + 1;
      pFVar3 = p->vInputs;
    } while (lVar4 < pFVar3->nSize);
  }
  uVar2 = Fraig_ManSimulateBitNode_rec(p,(Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe));
  return uVar2 ^ (uint)pNode & 1;
}

Assistant:

int Fraig_ManSimulateBitNode( Fraig_Man_t * p, Fraig_Node_t * pNode, int * pModel )
{
    int fCompl, RetValue, i;
    // set the PI values
    Fraig_ManIncrementTravId( p );
    for ( i = 0; i < p->vInputs->nSize; i++ )
    {
        Fraig_NodeSetTravIdCurrent( p, p->vInputs->pArray[i] );
        p->vInputs->pArray[i]->fMark3 = pModel[i];
    }
    // perform the traversal
    fCompl = Fraig_IsComplement(pNode);
    RetValue = Fraig_ManSimulateBitNode_rec( p, Fraig_Regular(pNode) );
    return fCompl ^ RetValue;
}